

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffnchk(fitsfile *fptr,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  char block [2881];
  char acStack_b78 [2880];
  undefined1 local_38;
  
  iVar4 = *status;
  if (iVar4 < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    pFVar1 = fptr->Fptr;
    if (pFVar1->datastart == -1) {
      iVar4 = 0;
    }
    else {
      lVar5 = pFVar1->datastart - pFVar1->headstart[pFVar1->curhdu];
      iVar4 = 0;
      ffmbyt(fptr,pFVar1->headstart[pFVar1->curhdu],0,status);
      local_38 = 0;
      if (0xb3f < lVar5) {
        lVar5 = lVar5 / 0xb40;
        iVar6 = -1;
        do {
          iVar2 = ffgbyt(fptr,0xb40,acStack_b78,status);
          if (0 < iVar2) {
            return 0;
          }
          sVar3 = strlen(acStack_b78);
          if ((int)sVar3 != 0xb40) {
            return (int)sVar3 - iVar6;
          }
          iVar6 = iVar6 + -0xb40;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
    }
  }
  return iVar4;
}

Assistant:

int ffnchk(fitsfile *fptr,  /* I - FITS file pointer                     */
           int *status)     /* IO - error status                         */
/*
  function returns the position of the first null character (ASCII 0), if
  any, in the current header.  Null characters are illegal, but the other
  CFITSIO routines that read the header will not detect this error, because
  the null gets interpreted as a normal end of string character.
*/
{
    long ii, nblock;
    LONGLONG bytepos;
    int length, nullpos;
    char block[2881];
    
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        return(0);  /* Don't check a file that is just being created.  */
                    /* It cannot contain nulls since CFITSIO wrote it. */
    }
    else
    {
        /* calculate number of blocks in the header */
        nblock = (long) (( (fptr->Fptr)->datastart - 
                   (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) / 2880);
    }

    bytepos = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu];
    ffmbyt(fptr, bytepos, REPORT_EOF, status);  /* move to read pos. */

    block[2880] = '\0';
    for (ii = 0; ii < nblock; ii++)
    {
        if (ffgbyt(fptr, 2880, block, status) > 0)
            return(0);   /* read error of some sort */

        length = strlen(block);
        if (length != 2880)
        {
            nullpos = (ii * 2880) + length + 1;
            return(nullpos);
        }
    }

    return(0);
}